

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein.cpp
# Opt level: O0

idx_t duckdb::LevenshteinDistance(string_t *txt,string_t *tgt)

{
  value_type vVar1;
  idx_t iVar2;
  idx_t iVar3;
  char *pcVar4;
  char *pcVar5;
  reference pvVar6;
  unsigned_long uVar7;
  unsigned_long b;
  string_t *in_RSI;
  string_t *in_RDI;
  idx_t pos_tgt_1;
  idx_t pos_txt;
  idx_t pos_tgt;
  idx_t cost_deletion;
  idx_t cost_insertion;
  idx_t cost_substitution;
  vector<unsigned_long,_true> distances1;
  vector<unsigned_long,_true> distances0;
  char *tgt_str;
  char *txt_str;
  idx_t tgt_len;
  idx_t txt_len;
  allocator_type *in_stack_fffffffffffffeb8;
  vector<unsigned_long,_true> *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<unsigned_long,_true> *in_stack_fffffffffffffed0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  unsigned_long local_a0;
  idx_t local_8;
  
  iVar2 = string_t::GetSize(in_RDI);
  iVar3 = string_t::GetSize(in_RSI);
  local_8 = iVar3;
  if ((iVar2 != 0) && (local_8 = iVar2, iVar3 != 0)) {
    pcVar4 = string_t::GetData((string_t *)in_stack_fffffffffffffec0);
    pcVar5 = string_t::GetData((string_t *)in_stack_fffffffffffffec0);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xea330b);
    vector<unsigned_long,_true>::vector
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (value_type_conflict *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xea3339);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xea3367);
    vector<unsigned_long,_true>::vector
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (value_type_conflict *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xea3395);
    for (local_b8 = 0; local_b8 <= iVar3; local_b8 = local_b8 + 1) {
      pvVar6 = vector<unsigned_long,_true>::operator[]
                         (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      *pvVar6 = local_b8;
    }
    for (local_c0 = 0; local_c0 < iVar2; local_c0 = local_c0 + 1) {
      pvVar6 = vector<unsigned_long,_true>::operator[]
                         (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      *pvVar6 = local_c0 + 1;
      for (local_c8 = 0; local_c8 < iVar3; local_c8 = local_c8 + 1) {
        pvVar6 = vector<unsigned_long,_true>::operator[]
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        uVar7 = *pvVar6 + 1;
        pvVar6 = vector<unsigned_long,_true>::operator[]
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        vVar1 = *pvVar6;
        pvVar6 = vector<unsigned_long,_true>::operator[]
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        local_a0 = *pvVar6;
        if (pcVar4[local_c0] != pcVar5[local_c8]) {
          local_a0 = local_a0 + 1;
        }
        b = MinValue<unsigned_long>(local_a0,vVar1 + 1);
        uVar7 = MinValue<unsigned_long>(uVar7,b);
        pvVar6 = vector<unsigned_long,_true>::operator[]
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        *pvVar6 = uVar7;
      }
      vector<unsigned_long,_true>::operator=
                (in_stack_fffffffffffffec0,(vector<unsigned_long,_true> *)in_stack_fffffffffffffeb8)
      ;
    }
    pvVar6 = vector<unsigned_long,_true>::operator[]
                       (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    local_8 = *pvVar6;
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xea36bb);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xea36c8);
  }
  return local_8;
}

Assistant:

static idx_t LevenshteinDistance(const string_t &txt, const string_t &tgt) {
	auto txt_len = txt.GetSize();
	auto tgt_len = tgt.GetSize();

	// If one string is empty, the distance equals the length of the other string
	if (txt_len == 0) {
		return tgt_len;
	} else if (tgt_len == 0) {
		return txt_len;
	}

	auto txt_str = txt.GetData();
	auto tgt_str = tgt.GetData();

	// Create two working vectors
	vector<idx_t> distances0(tgt_len + 1, 0);
	vector<idx_t> distances1(tgt_len + 1, 0);

	idx_t cost_substitution = 0;
	idx_t cost_insertion = 0;
	idx_t cost_deletion = 0;

	// initialize distances0 vector
	// edit distance for an empty txt string is just the number of characters to delete from tgt
	for (idx_t pos_tgt = 0; pos_tgt <= tgt_len; pos_tgt++) {
		distances0[pos_tgt] = pos_tgt;
	}

	for (idx_t pos_txt = 0; pos_txt < txt_len; pos_txt++) {
		// calculate distances1 (current raw distances) from the previous row

		distances1[0] = pos_txt + 1;

		for (idx_t pos_tgt = 0; pos_tgt < tgt_len; pos_tgt++) {
			cost_deletion = distances0[pos_tgt + 1] + 1;
			cost_insertion = distances1[pos_tgt] + 1;
			cost_substitution = distances0[pos_tgt];

			if (txt_str[pos_txt] != tgt_str[pos_tgt]) {
				cost_substitution += 1;
			}

			distances1[pos_tgt + 1] = MinValue(cost_deletion, MinValue(cost_substitution, cost_insertion));
		}
		// copy distances1 (current row) to distances0 (previous row) for next iteration
		// since data in distances1 is always invalidated, a swap without copy is more efficient
		distances0 = distances1;
	}

	return distances0[tgt_len];
}